

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O2

optional<common::PSBTError> __thiscall
wallet::ExternalSignerScriptPubKeyMan::FillPSBT
          (ExternalSignerScriptPubKeyMan *this,PartiallySignedTransaction *psbt,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  long lVar1;
  pointer pPVar2;
  bool bVar3;
  _Optional_payload_base<common::PSBTError> _Var4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  undefined7 in_register_00000081;
  PSBTInput *input;
  pointer input_00;
  long in_FS_OFFSET;
  ExternalSigner local_d0;
  string strFailReason;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000081,sign) == 0) {
    _Var4 = (_Optional_payload_base<common::PSBTError>)
            DescriptorScriptPubKeyMan::FillPSBT
                      (&this->super_DescriptorScriptPubKeyMan,psbt,txdata,sighash_type,false,
                       bip32derivs,n_signed,finalize);
    uVar5 = (ulong)_Var4 & 0xffffff0000000000;
    uVar6 = (ulong)_Var4 & 0xffffffff;
  }
  else {
    pPVar2 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar7 = 1;
    for (input_00 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl
                    .super__Vector_impl_data._M_start; input_00 != pPVar2; input_00 = input_00 + 1)
    {
      bVar3 = PSBTInputSigned(input_00);
      bVar7 = bVar7 & bVar3;
    }
    if (bVar7 == 0) {
      strFailReason._M_dataplus._M_p = (pointer)&strFailReason.field_2;
      strFailReason._M_string_length = 0;
      strFailReason.field_2._M_local_buf[0] = '\0';
      GetExternalSigner();
      bVar3 = ExternalSigner::SignTransaction(&local_d0,psbt,&strFailReason);
      ExternalSigner::~ExternalSigner(&local_d0);
      if (bVar3) {
        if (finalize) {
          FinalizePSBT(psbt);
        }
        _Var4._M_payload = (_Storage<common::PSBTError,_true>)0x0;
        _Var4._M_engaged = false;
        _Var4._5_3_ = 0;
      }
      else {
        tinyformat::format<std::__cxx11::string>
                  ((ostream *)&std::cerr,"Failed to sign: %s\n",&strFailReason);
        _Var4._M_payload = (_Storage<common::PSBTError,_true>)0x0;
        _Var4._M_engaged = true;
        _Var4._5_3_ = 0;
      }
      std::__cxx11::string::~string((string *)&strFailReason);
      uVar6 = 3;
    }
    else {
      uVar6 = 0;
      _Var4._M_payload = (_Storage<common::PSBTError,_true>)0x0;
      _Var4._M_engaged = false;
      _Var4._5_3_ = 0;
    }
    uVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<common::PSBTError,_true,_true>)
           (_Optional_base<common::PSBTError,_true,_true>)
           ((ulong)_Var4 & 0xff00000000 | uVar6 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<PSBTError> ExternalSignerScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbt, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (!sign) {
        return DescriptorScriptPubKeyMan::FillPSBT(psbt, txdata, sighash_type, false, bip32derivs, n_signed, finalize);
    }

    // Already complete if every input is now signed
    bool complete = true;
    for (const auto& input : psbt.inputs) {
        // TODO: for multisig wallets, we should only care if all _our_ inputs are signed
        complete &= PSBTInputSigned(input);
    }
    if (complete) return {};

    std::string strFailReason;
    if(!GetExternalSigner().SignTransaction(psbt, strFailReason)) {
        tfm::format(std::cerr, "Failed to sign: %s\n", strFailReason);
        return PSBTError::EXTERNAL_SIGNER_FAILED;
    }
    if (finalize) FinalizePSBT(psbt); // This won't work in a multisig setup
    return {};
}